

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O2

void __thiscall QBoxLayout::addItem(QBoxLayout *this,QLayoutItem *item)

{
  long lVar1;
  parameter_type t;
  
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  t = (parameter_type)operator_new(0x10);
  t->item = item;
  t->stretch = 0;
  t->magic = false;
  QList<QBoxLayoutItem_*>::append((QList<QBoxLayoutItem_*> *)(lVar1 + 0xb0),t);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  return;
}

Assistant:

void QBoxLayout::addItem(QLayoutItem *item)
{
    Q_D(QBoxLayout);
    QBoxLayoutItem *it = new QBoxLayoutItem(item);
    d->list.append(it);
    invalidate();
}